

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O0

void arima_exec(arima_object obj,double *inp)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  double dVar5;
  double dVar6;
  double eps;
  int M;
  int N;
  int d;
  int q;
  int p;
  double *inp_local;
  arima_object obj_local;
  
  iVar4 = obj->p;
  iVar1 = obj->q;
  iVar2 = obj->d;
  iVar3 = obj->N;
  if (obj->method == 0) {
    iVar4 = as154(inp,obj->N,obj->optmethod,obj->p,obj->d,obj->q,(double *)(obj + 1),
                  (double *)(&obj[1].N + (long)iVar4 * 2),&obj->mean,&obj->var,
                  (double *)(&obj[1].N + (long)iVar4 * 2 + (long)iVar1 * 2),&obj->loglik,
                  (double *)
                  ((long)obj +
                  (long)iVar2 * -8 + (long)iVar3 * 8 + (long)iVar1 * 8 + (long)iVar4 * 8 + 0x78),
                  obj->cssml);
    obj->retval = iVar4;
    iVar4 = obj->Nused;
    dVar6 = obj->loglik;
    dVar5 = log(6.28318);
    obj->loglik = (double)iVar4 * (dVar6 + dVar6 + 1.0 + dVar5) * -0.5;
    obj->aic = ((double)(obj->p + obj->q + obj->M) * 2.0 - (obj->loglik + obj->loglik)) + 2.0;
  }
  else if (obj->method == 1) {
    iVar4 = css(inp,obj->N,obj->optmethod,obj->p,obj->d,obj->q,(double *)(obj + 1),
                (double *)(&obj[1].N + (long)iVar4 * 2),&obj->mean,&obj->var,
                (double *)(&obj[1].N + (long)iVar4 * 2 + (long)iVar1 * 2),&obj->loglik,
                (double *)
                ((long)obj +
                (long)iVar2 * -8 + (long)iVar3 * 8 + (long)iVar1 * 8 + (long)iVar4 * 8 + 0x78));
    obj->retval = iVar4;
    iVar4 = obj->Nused;
    dVar6 = obj->loglik;
    dVar5 = log(6.28318);
    obj->loglik = (double)iVar4 * (dVar6 + dVar6 + 1.0 + dVar5) * -0.5;
  }
  else if (obj->method == 2) {
    dVar6 = macheps();
    iVar4 = nlalsm(inp,obj->N,obj->p,obj->d,obj->q,(double *)(obj + 1),
                   (double *)(&obj[1].N + (long)iVar4 * 2),obj->M,&obj->mean,&obj->var,dVar6,
                   (double *)
                   ((long)obj +
                   (long)iVar2 * -8 + (long)iVar3 * 8 + (long)iVar1 * 8 + (long)iVar4 * 8 + 0x78),
                   (double *)(&obj[1].N + (long)iVar4 * 2 + (long)iVar1 * 2));
    obj->retval = iVar4;
  }
  return;
}

Assistant:

void arima_exec(arima_object obj, double *inp) {
	int p,q,d,N,M;
	double eps;

	p = obj->p;
	q = obj->q;
	d = obj->d;
	N = obj->N;

	if (obj->d > 0) {
		M = 0;
	}
	else {
		M = 1;
	}

	if (obj->method == 0) {
		obj->retval = as154(inp, obj->N, obj->optmethod, obj->p, obj->d, obj->q, obj->params, obj->params + p, &obj->mean, &obj->var, obj->params + p + q,&obj->loglik,
			obj->params + p + q + N - d,obj->cssml);
		obj->loglik = -0.5 * (obj->Nused * (2 * obj->loglik + 1.0 + log(2 * 3.14159)));
		obj->aic = -2.0 * obj->loglik + 2.0 * (obj->p + obj->q + obj->M) + 2.0;
	}
	else if (obj->method == 1) {
		obj->retval = css(inp, obj->N, obj->optmethod, obj->p, obj->d, obj->q, obj->params, obj->params + p, &obj->mean, &obj->var, obj->params + p + q, &obj->loglik,
			obj->params + p + q + N - d);
		obj->loglik = -0.5 * (obj->Nused * (2 * obj->loglik + 1.0 + log(2 * 3.14159)));
	}
	else if (obj->method == 2) {
		eps = macheps();
		obj->retval = nlalsm(inp, obj->N, obj->p, obj->d, obj->q, obj->params, obj->params + p, obj->M, &obj->mean, &obj->var, eps, obj->params + p + q + N - d, obj->params + p + q);
	}


}